

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_24939c::Db::parseSimpleId(Db *this)

{
  char cVar1;
  Node *local_28;
  Node *TA;
  Node *SN;
  Db *this_local;
  
  SN = (Node *)this;
  TA = parseSourceName(this,(NameState *)0x0);
  if (TA == (Node *)0x0) {
    this_local = (Db *)0x0;
  }
  else {
    cVar1 = look(this,0);
    if (cVar1 == 'I') {
      local_28 = parseTemplateArgs(this,false);
      if (local_28 == (Node *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                     ((Db *)this,&TA,&local_28);
      }
    }
    else {
      this_local = (Db *)TA;
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseSimpleId() {
  Node *SN = parseSourceName(/*NameState=*/nullptr);
  if (SN == nullptr)
    return nullptr;
  if (look() == 'I') {
    Node *TA = parseTemplateArgs();
    if (TA == nullptr)
      return nullptr;
    return make<NameWithTemplateArgs>(SN, TA);
  }
  return SN;
}